

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

int above(btVector3 *vertices,int3 *t,btVector3 *p,btScalar epsilon)

{
  int iVar1;
  btVector3 bVar2;
  
  bVar2 = TriNormal(vertices + t->x,vertices + t->y,vertices + t->z);
  iVar1 = t->x;
  return (int)(epsilon <
              (p->m_floats[2] - vertices[iVar1].m_floats[2]) * bVar2.m_floats[2] +
              (p->m_floats[0] - vertices[iVar1].m_floats[0]) * bVar2.m_floats[0] +
              bVar2.m_floats[1] * (p->m_floats[1] - vertices[iVar1].m_floats[1]));
}

Assistant:

int above(btVector3* vertices,const int3& t, const btVector3 &p, btScalar epsilon) 
{
	btVector3 n=TriNormal(vertices[t[0]],vertices[t[1]],vertices[t[2]]);
	return (btDot(n,p-vertices[t[0]]) > epsilon); // EPSILON???
}